

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int update_send_key(ptls_t *tls,ptls_buffer_t *_sendbuf,int request_update)

{
  ulong body_size_00;
  size_t body_size;
  long local_98;
  size_t body_start;
  size_t capacity;
  size_t local_80;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  size_t sendbuf_orig_off;
  undefined1 auStack_50 [4];
  int ret;
  st_ptls_record_message_emitter_t emitter;
  int request_update_local;
  ptls_buffer_t *_sendbuf_local;
  ptls_t *tls_local;
  
  emitter.rec_start._4_4_ = request_update;
  init_record_message_emitter(tls,(st_ptls_record_message_emitter_t *)auStack_50,_sendbuf);
  _emitter = (ptls_message_emitter_t *)_auStack_50->off;
  _buf = (ptls_buffer_t *)auStack_50;
  sendbuf_orig_off._4_4_ = (*(code *)emitter.super.record_header_length)(_buf);
  if (sendbuf_orig_off._4_4_ == 0) {
    _key_sched = (ptls_key_schedule_t *)_buf->base;
    mess_start = 0;
    local_80 = *(size_t *)_key_sched->secret;
    capacity._7_1_ = 0x18;
    sendbuf_orig_off._4_4_ =
         ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
    if (sendbuf_orig_off._4_4_ == 0) {
      body_start = 3;
      sendbuf_orig_off._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
      if (sendbuf_orig_off._4_4_ == 0) {
        local_98 = *(long *)_key_sched->secret;
        body_size._7_1_ = emitter.rec_start._4_4_ != 0;
        sendbuf_orig_off._4_4_ = ptls_buffer__do_pushv(_auStack_50,(void *)((long)&body_size + 7),1)
        ;
        if (sendbuf_orig_off._4_4_ == 0) {
          body_size_00 = *(long *)_key_sched->secret - local_98;
          if (body_start == 0xffffffffffffffff) {
            sendbuf_orig_off._4_4_ =
                 ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)_key_sched,body_size_00);
            if (sendbuf_orig_off._4_4_ != 0) goto LAB_001107f7;
          }
          else {
            for (; body_start != 0; body_start = body_start - 1) {
              *(char *)(*(long *)_key_sched + (local_98 - body_start)) =
                   (char)(body_size_00 >> (((char)body_start + -1) * '\b' & 0x3fU));
            }
          }
          sendbuf_orig_off._4_4_ = 0;
          if (mess_start != 0) {
            ptls__key_schedule_update_hash
                      ((ptls_key_schedule_t *)mess_start,(uint8_t *)(*(long *)_key_sched + local_80)
                       ,*(long *)_key_sched->secret - local_80);
          }
          sendbuf_orig_off._4_4_ = (*(code *)_buf[1].base)(_buf);
          if ((sendbuf_orig_off._4_4_ == 0) &&
             (sendbuf_orig_off._4_4_ = update_traffic_key(tls,1), sendbuf_orig_off._4_4_ == 0)) {
            sendbuf_orig_off._4_4_ = 0;
          }
        }
      }
    }
  }
LAB_001107f7:
  if (sendbuf_orig_off._4_4_ != 0) {
    _auStack_50->off = (size_t)_emitter;
  }
  return sendbuf_orig_off._4_4_;
}

Assistant:

static int update_send_key(ptls_t *tls, ptls_buffer_t *_sendbuf, int request_update)
{
    struct st_ptls_record_message_emitter_t emitter;
    int ret;

    init_record_message_emitter(tls, &emitter, _sendbuf);
    size_t sendbuf_orig_off = emitter.super.buf->off;

    ptls_push_message(&emitter.super, NULL, PTLS_HANDSHAKE_TYPE_KEY_UPDATE,
                      { ptls_buffer_push(emitter.super.buf, !!request_update); });
    if ((ret = update_traffic_key(tls, 1)) != 0)
        goto Exit;
    ret = 0;

Exit:
    if (ret != 0)
        emitter.super.buf->off = sendbuf_orig_off;
    return ret;
}